

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

sexp_conflict
sexp_bit_and(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  sexp_conflict psVar4;
  char cVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  sexp_conflict x2;
  sexp_conflict y2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict local_70;
  sexp_conflict local_68;
  sexp_conflict local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_70 = (sexp_conflict)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_68 = (sexp_conflict)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  local_60 = (sexp_conflict)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if (((ulong)x & 1) != 0) {
    if (((ulong)y & 1) != 0) {
      return (sexp_conflict)((ulong)y & (ulong)x);
    }
    if ((((ulong)y & 2) == 0) && (y->tag == 0xc)) {
      psVar4 = sexp_bit_and(ctx,self,n,y,x);
      return psVar4;
    }
  }
  if ((((ulong)x & 3) != 0) || (x->tag != 0xc)) {
    psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,2,x);
    return psVar4;
  }
  local_58.var = &local_70;
  local_38.next = &local_58;
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_38.next;
  local_38.var = &local_68;
  local_48.next = &local_38;
  (ctx->value).context.saves = local_48.next;
  local_48.var = &local_60;
  (ctx->value).context.saves = &local_48;
  local_68 = sexp_twos_complement(ctx,x);
  local_60 = sexp_twos_complement(ctx,y);
  if ((long)local_60 < 0 && ((ulong)local_60 & 1) != 0) {
    local_60 = sexp_fixnum_to_twos_complement(ctx,local_60,(local_68->value).promise.donep);
  }
  if (((ulong)local_60 & 1) == 0) {
    if ((((ulong)local_60 & 2) == 0) && (local_60->tag == 0xc)) {
      lVar1 = (local_68->value).fileno.fd;
      lVar2 = (local_60->value).fileno.fd;
      psVar4 = local_68;
      if (lVar1 <= lVar2) {
        psVar4 = local_60;
      }
      local_70 = (sexp_conflict)sexp_copy_bignum(ctx,0,psVar4,0);
      lVar3 = (local_70->value).fileno.fd;
      if (0 < lVar3) {
        lVar6 = 0;
        do {
          if (lVar6 < lVar1) {
            uVar7 = *(ulong *)((long)&local_68->value + lVar6 * 8 + 0x10);
          }
          else {
            uVar7 = (ulong)((local_68->value).flonum_bits[0] >> 7);
          }
          if (lVar6 < lVar2) {
            uVar8 = *(ulong *)((long)&local_60->value + lVar6 * 8 + 0x10);
          }
          else {
            uVar8 = (ulong)((local_60->value).flonum_bits[0] >> 7);
          }
          *(ulong *)((long)&local_70->value + lVar6 * 8 + 0x10) = uVar8 & uVar7;
          lVar6 = lVar6 + 1;
        } while (lVar3 != lVar6);
      }
      if ((((local_68->value).flonum_bits[0] < '\0') || ((local_60->value).flonum_bits[0] < '\0'))
         && (*(long *)((long)&local_70->value + lVar3 * 8 + 8) < 0)) {
        sexp_set_twos_complement(local_70);
        cVar5 = (local_70->value).flonum_bits[0];
        if (cVar5 < '\x01') goto LAB_0010141d;
      }
      else {
        cVar5 = (local_70->value).flonum_bits[0];
        if (-1 < cVar5) goto LAB_0010141d;
      }
      if ((((ulong)local_70 & 3) == 0) && (local_70->tag == 0xc)) {
        (local_70->value).flonum_bits[0] = -cVar5;
      }
      else if (((ulong)local_70 & 1) != 0) {
        local_70 = (sexp_conflict)(1 - ((ulong)local_70 & 0xfffffffffffffffe));
      }
    }
    else {
      local_70 = (sexp_conflict)sexp_type_exception(ctx,self,2);
    }
  }
  else {
    local_70 = (sexp_conflict)(((local_68->value).uvector.length * 2 & (ulong)local_60) + 1);
  }
LAB_0010141d:
  (ctx->value).context.saves = local_58.next;
  psVar4 = (sexp_conflict)sexp_bignum_normalize(local_70);
  return psVar4;
}

Assistant:

sexp sexp_bit_and (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y) {
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, lenx, leny, i;
#endif
  sexp_gc_var3(res, x2, y2);
  if (sexp_fixnump(x) && sexp_fixnump(y)) {
    return (sexp) ((sexp_uint_t)x & (sexp_uint_t)y);  /* safe to AND tags */
#if SEXP_USE_BIGNUMS
  } else if (sexp_fixnump(x) && sexp_bignump(y)) {
    return sexp_bit_and(ctx, self, n, y, x);
  } else if (sexp_bignump(x)) {
    sexp_gc_preserve3(ctx, res, x2, y2);
    x2 = sexp_twos_complement(ctx, x);
    y2 = sexp_twos_complement(ctx, y);
    if (sexp_fixnump(y2) && sexp_unbox_fixnum(y2) < 0)
      y2 = sexp_fixnum_to_twos_complement(ctx, y2, sexp_bignum_length(x2));
    if (sexp_fixnump(y2)) {
      res = sexp_make_fixnum(sexp_unbox_fixnum(y2) & sexp_bignum_data(x2)[0]);
    } else if (sexp_bignump(y2)) {
      lenx = sexp_bignum_length(x2);
      leny = sexp_bignum_length(y2);
      if (leny < lenx)
        res = sexp_copy_bignum(ctx, NULL, x2, 0);
      else
        res = sexp_copy_bignum(ctx, NULL, y2, 0);
      for (i=0, len=sexp_bignum_length(res); i<len; i++)
        sexp_bignum_data(res)[i]
          = (i<lenx ? sexp_bignum_data(x2)[i] : sexp_bignum_sign(x2) < 0 ? -1 : 0) &
            (i<leny ? sexp_bignum_data(y2)[i] : sexp_bignum_sign(y2) < 0 ? -1 : 0);
      if ((sexp_bignum_sign(x2) < 0 || sexp_bignum_sign(y2) < 0) && ((sexp_sint_t)(sexp_bignum_data(res)[len-1])) < 0) {
        sexp_set_twos_complement(res);
        if (sexp_bignum_sign(res) > 0) {
          sexp_negate_exact(res);
        }
      } else if (sexp_bignum_sign(res) < 0) {
        sexp_negate_exact(res);
      }
    } else {
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y2);
    }
    sexp_gc_release3(ctx);
    return sexp_bignum_normalize(res);
#endif
  } else {
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
}